

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path_handle_graph.cpp
# Opt level: O2

size_t __thiscall
handlegraph::PathHandleGraph::get_step_count(PathHandleGraph *this,handle_t *handle)

{
  size_t count;
  size_t local_38;
  undefined1 *local_30;
  _Any_data local_28;
  code *local_18;
  code *local_10;
  
  local_30 = (undefined1 *)&local_38;
  local_38 = 0;
  local_28._8_8_ = 0;
  local_28._M_unused._M_object = &local_30;
  local_10 = std::
             _Function_handler<bool_(const_handlegraph::step_handle_t_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vgteam[P]libhandlegraph/src/include/handlegraph/iteratee.hpp:85:16)>
             ::_M_invoke;
  local_18 = std::
             _Function_handler<bool_(const_handlegraph::step_handle_t_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vgteam[P]libhandlegraph/src/include/handlegraph/iteratee.hpp:85:16)>
             ::_M_manager;
  (**(code **)(*(long *)this + 0x130))();
  std::_Function_base::~_Function_base((_Function_base *)&local_28);
  return local_38;
}

Assistant:

size_t PathHandleGraph::get_step_count(const handle_t& handle) const {
    size_t count = 0;
    for_each_step_on_handle(handle, [&](const step_handle_t& step) {
        ++count;
    });
    return count;
}